

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O3

PostOrderTreeDFIterator<spvtools::opt::Loop> * __thiscall
spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
          (PostOrderTreeDFIterator<spvtools::opt::Loop> *this)

{
  _Elt_pointer ppVar1;
  pointer ppLVar2;
  pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
  local_28;
  
  if (this->current_ != (NodePtr)0x0) {
    ppVar1 = (this->parent_iterators_).c.
             super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar1 == (this->parent_iterators_).c.
                  super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      this->current_ = (NodePtr)0x0;
    }
    else {
      if (ppVar1 == (this->parent_iterators_).c.
                    super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar1 = (this->parent_iterators_).c.
                 super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      ppLVar2 = ppVar1[-1].second._M_current;
      if (ppLVar2 ==
          ((ppVar1[-1].first)->nested_loops_).
          super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this->current_ = ppVar1[-1].first;
        std::
        deque<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
        ::pop_back(&(this->parent_iterators_).c);
      }
      else {
        local_28.first = *ppLVar2;
        this->current_ = local_28.first;
        ppVar1[-1].second._M_current = ppLVar2 + 1;
        ppLVar2 = ((local_28.first)->nested_loops_).
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppLVar2 !=
            ((local_28.first)->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_28.second._M_current = ppLVar2 + 1;
            std::
            deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
            ::
            emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
                      ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                        *)&this->parent_iterators_,&local_28);
            local_28.first =
                 *(this->current_->nested_loops_).
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            this->current_ = local_28.first;
            ppLVar2 = ((local_28.first)->nested_loops_).
                      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (ppLVar2 !=
                   ((local_28.first)->nested_loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
    }
  }
  return this;
}

Assistant:

PostOrderTreeDFIterator& operator++() {
    MoveToNextNode();
    return *this;
  }